

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O2

void buffer_free(buffer_t *buffer)

{
  ulong uVar1;
  
  if (buffer != (buffer_t *)0x0) {
    if (buffer->fragment != (zip_uint8_t **)0x0) {
      for (uVar1 = 0; uVar1 < buffer->nfragments; uVar1 = uVar1 + 1) {
        free(buffer->fragment[uVar1]);
      }
      free(buffer->fragment);
    }
    free(buffer);
    return;
  }
  return;
}

Assistant:

static void
buffer_free(buffer_t *buffer) {
    zip_uint64_t i;

    if (buffer == NULL) {
	return;
    }

    if (buffer->fragment) {
	for (i = 0; i < buffer->nfragments; i++) {
	    free(buffer->fragment[i]);
	}
	free(buffer->fragment);
    }
    free(buffer);
}